

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleNamespace.cpp
# Opt level: O2

BOOL __thiscall Js::ModuleNamespace::IsWritable(ModuleNamespace *this,PropertyId propertyId)

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  bool bVar1;
  BOOL BVar2;
  uint uVar3;
  undefined1 local_40 [8];
  ModuleNameRecord moduleNameRecord;
  PropertyRecord *propertyRecord;
  undefined4 local_20;
  SimpleDictionaryPropertyDescriptor<int> propertyDescriptor;
  PropertyId propertyId_local;
  
  propertyRecord._4_2_ = 0x701;
  local_20 = 0xffffffff;
  propertyDescriptor._0_4_ = propertyId;
  moduleNameRecord._8_8_ =
       ThreadContext::GetPropertyName
                 (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                  threadContext,propertyId);
  if (((PropertyRecord *)moduleNameRecord._8_8_)->isSymbol == true) {
    BVar2 = DynamicObject::IsWritable(&this->super_DynamicObject,propertyId);
    return BVar2;
  }
  this_00 = (this->propertyMap).ptr;
  if ((this_00 ==
       (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
        *)0x0) ||
     (bVar1 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
              ::TryGetValue<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                          *)this_00,(PropertyRecord **)&moduleNameRecord.bindingName,
                         (SimpleDictionaryPropertyDescriptor<int> *)((long)&propertyRecord + 4)),
     !bVar1)) {
    this_01 = (this->unambiguousNonLocalExports).ptr;
    if (this_01 !=
        (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      local_40 = (undefined1  [8])0x0;
      bVar1 = JsUtil::
              BaseDictionary<int,_Js::ModuleNameRecord,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<int>(this_01,(int *)&propertyDescriptor,(ModuleNameRecord *)local_40);
      propertyId = propertyDescriptor._0_4_;
      if (bVar1) {
        return 1;
      }
    }
    uVar3 = DynamicObject::IsWritable(&this->super_DynamicObject,propertyId);
  }
  else {
    uVar3 = propertyRecord._5_1_ >> 2 & 1;
  }
  return uVar3;
}

Assistant:

BOOL ModuleNamespace::IsWritable(PropertyId propertyId)
    {
        SimpleDictionaryPropertyDescriptor<BigPropertyIndex> propertyDescriptor;
        const Js::PropertyRecord* propertyRecord = GetScriptContext()->GetThreadContext()->GetPropertyName(propertyId);
        if (propertyRecord->IsSymbol())
        {
            return this->DynamicObject::IsWritable(propertyId);
        }

        if (propertyMap != nullptr && propertyMap->TryGetValue(propertyRecord, &propertyDescriptor))
        {
            return !!(propertyDescriptor.Attributes & PropertyWritable);
        }

        if (unambiguousNonLocalExports != nullptr)
        {
            ModuleNameRecord moduleNameRecord;
            if (unambiguousNonLocalExports->TryGetValue(propertyId, &moduleNameRecord))
            {
                return !!(PropertyModuleNamespaceDefault & PropertyWritable);
            }
        }

        return DynamicObject::IsWritable(propertyId);
    }